

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

DynamicStackArray<float,_16UL,_64UL> * __thiscall
embree::DynamicStackArray<float,_16UL,_64UL>::operator=
          (DynamicStackArray<float,_16UL,_64UL> *this,DynamicStackArray<float,_16UL,_64UL> *other)

{
  float fVar1;
  size_t i;
  DynamicStackArray<float,_16UL,_64UL> *pDVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  pDVar2 = (DynamicStackArray<float,_16UL,_64UL> *)other->data;
  uVar6 = 0;
  do {
    fVar1 = pDVar2->arr[uVar6];
    pDVar2 = (DynamicStackArray<float,_16UL,_64UL> *)this->data;
    if ((0xf < uVar6) && (pDVar2 == this)) {
      pfVar3 = (float *)operator_new__(0x100);
      this->data = pfVar3;
      lVar4 = 0;
      do {
        this->data[lVar4] = this->arr[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      pDVar2 = (DynamicStackArray<float,_16UL,_64UL> *)this->data;
    }
    pDVar2->arr[uVar6] = fVar1;
    uVar6 = uVar6 + 1;
    pDVar2 = (DynamicStackArray<float,_16UL,_64UL> *)other->data;
    uVar5 = 0x40;
    if (pDVar2 == other) {
      uVar5 = 0x10;
    }
  } while (uVar6 < uVar5);
  return this;
}

Assistant:

DynamicStackArray& operator= (const DynamicStackArray& other)
    {
      for (size_t i=0; i<other.size(); i++)
        this->operator[] (i) = other[i];

      return *this;
    }